

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

int tcg_gen_code_sparc64(TCGContext_conflict8 *s,TranslationBlock *tb)

{
  TCGTemp **ppTVar1;
  char **ppcVar2;
  ushort uVar3;
  TCGOp *pTVar4;
  TCGTemp *pTVar5;
  TCGOpDef *pTVar6;
  uint *puVar7;
  TCGArgConstraint *pTVar8;
  TCGLabelQemuLdst *pTVar9;
  uintptr_t value;
  byte bVar10;
  tcg_insn_unit tVar11;
  _Bool _Var12;
  TCGOpcode TVar13;
  TCGReg TVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  TCGOp *pTVar18;
  ulong uVar19;
  ulong uVar20;
  TCGType *pTVar21;
  tcg_insn_unit *ptVar22;
  byte bVar23;
  TCGLifeData arg_life;
  uint uVar24;
  TCGRegSet TVar25;
  char cVar29;
  int _small;
  long lVar26;
  undefined1 *puVar27;
  undefined8 uVar28;
  TCGOpcode TVar30;
  TCGRegSet TVar31;
  TCGType base;
  TCGType r;
  ulong uVar32;
  void **ppvVar33;
  TCGTemp *pTVar34;
  tcg_target_ulong val;
  TCGLabel *pTVar35;
  TCGOp *pTVar36;
  anon_struct_16_2_9a852307_for_labels *paVar37;
  uint uVar38;
  TCGRegSet allocated_regs;
  uint allocated_regs_00;
  TCGArg TVar39;
  TCGType TVar40;
  TCGType TVar41;
  TCGCond cond;
  ulong uVar42;
  long lVar43;
  TCGArg TVar44;
  TCGType TVar45;
  TCGType TVar47;
  uint uVar48;
  anon_union_16_2_aaf24f3d_for_link *paVar49;
  TCGRegSet preferred_regs;
  TCGType TVar50;
  TCGType TVar51;
  int iVar52;
  long lVar53;
  anon_struct_16_2_9a852307_for_ldst_labels *paVar54;
  tcg_insn_unit tVar55;
  uint uVar56;
  long lVar57;
  tcg_insn_unit **pptVar58;
  TCGRelocation *pTVar59;
  bool bVar60;
  tcg_target_long tStackY_180;
  TCGArg TVar61;
  uint local_12c;
  TCGArg new_args [16];
  int local_78 [4];
  int local_68;
  int local_64;
  TCGType TVar46;
  TCGType rexw;
  
  pcVar16 = getenv("UNICORN_DEBUG");
  if (pcVar16 != (char *)0x0) {
    tcg_dump_ops_sparc64(s,false,"TCG before optimization:");
  }
  tcg_optimize_sparc64(s);
  paVar49 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  pTVar4 = (s->ops).tqh_first;
  bVar23 = 0;
LAB_008f0371:
  do {
    pTVar36 = pTVar4;
    if (pTVar36 == (TCGOp *)0x0) break;
    pTVar4 = (pTVar36->link).tqe_next;
    uVar38 = *(uint *)pTVar36;
    if ((char)uVar38 != -0x7f) {
      uVar24 = uVar38 & 0xff;
      if (uVar24 == 0x84) {
LAB_008f03f2:
        bVar10 = 1;
LAB_008f0413:
        bVar60 = bVar23 == 0;
        bVar23 = bVar10;
        if (bVar60) goto LAB_008f0371;
      }
      else {
        if (uVar24 == 2) {
          bVar10 = ((byte)pTVar36->args[(ulong)((uVar38 >> 8 & 0xf) + (uVar38 >> 0xc & 0xf)) + 1] &
                   8) >> 3 | bVar23;
          goto LAB_008f0413;
        }
        if ((uVar24 == 3) || (uVar24 == 0x82)) goto LAB_008f03f2;
        bVar10 = bVar23;
        if (uVar24 != 1) goto LAB_008f0413;
        uVar38 = *(uint *)pTVar36->args[0];
        if (0xffff < uVar38) {
          bVar23 = 0;
          if ((uVar38 & 0xffff0000) != 0x10000) goto LAB_008f0371;
          pTVar18 = (TCGOp *)((pTVar36->link).tqe_circ.tql_prev)->tql_prev->tql_next;
          bVar23 = 0;
          if ((*(char *)pTVar18 != '\x03') ||
             (bVar23 = 0, (uint *)pTVar36->args[0] != (uint *)pTVar18->args[0])) goto LAB_008f0371;
          tcg_op_remove_sparc64(s,pTVar18);
          bVar10 = 0;
        }
      }
      tcg_op_remove_sparc64(s,pTVar36);
      bVar23 = bVar10;
    }
  } while( true );
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    uVar32 = 0;
    uVar17 = (ulong)(uint)s->nb_globals;
    if (s->nb_globals < 1) {
      uVar17 = uVar32;
    }
    for (; uVar17 * 0x38 - uVar32 != 0; uVar32 = uVar32 + 0x38) {
      if (((&s->temps[0].field_0x4)[uVar32] & 2) == 0) {
        pTVar34 = (TCGTemp *)0x0;
      }
      else {
        iVar52 = s->nb_temps;
        s->nb_temps = iVar52 + 1;
        pTVar34 = s->temps + iVar52;
        ppcVar2 = &s->temps[iVar52].name;
        *ppcVar2 = (char *)0x0;
        ppcVar2[1] = (char *)0x0;
        ppTVar1 = &s->temps[iVar52].mem_base;
        *ppTVar1 = (TCGTemp *)0x0;
        ppTVar1[1] = (TCGTemp *)0x0;
        s->temps[iVar52].state_ptr = (void *)0x0;
        *(undefined8 *)(s->temps + iVar52) = 0;
        s->temps[iVar52].val = 0;
        lVar26 = (ulong)(byte)(&s->temps[0].field_0x3)[uVar32] << 0x18;
        *(long *)(s->temps + iVar52) = lVar26;
        *(ulong *)(s->temps + iVar52) =
             (ulong)((uint)(byte)(&s->temps[0].field_0x2)[uVar32] << 0x10 | (uint)lVar26);
      }
      *(TCGTemp **)((long)&s->temps[0].state_ptr + uVar32) = pTVar34;
      *(undefined8 *)((long)&s->temps[0].state + uVar32) = 1;
    }
    iVar52 = s->nb_temps;
    ppvVar33 = &s->temps[uVar17].state_ptr;
    for (; (long)uVar17 < (long)iVar52; uVar17 = uVar17 + 1) {
      *ppvVar33 = (void *)0x0;
      ppvVar33[-1] = (void *)0x1;
      ppvVar33 = ppvVar33 + 7;
    }
    bVar60 = false;
    pTVar4 = (s->ops).tqh_first;
    while (pTVar36 = pTVar4, pTVar36 != (TCGOp *)0x0) {
      uVar38 = *(uint *)pTVar36;
      if ((uVar38 & 0xff) == 2) {
        uVar24 = uVar38 >> 0xc & 0xf;
        uVar48 = uVar38 >> 8 & 0xf;
      }
      else {
        uVar24 = (uVar38 & 0xff) << 5;
        uVar48 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar24];
        uVar24 = (uint)(&s->tcg_op_defs->nb_oargs)[uVar24];
      }
      pTVar4 = (pTVar36->link).tqe_next;
      uVar38 = uVar38 >> 0x10;
      uVar32 = (ulong)uVar24;
      for (uVar17 = uVar32; uVar20 = uVar32, uVar17 < uVar48 + uVar24; uVar17 = uVar17 + 1) {
        TVar39 = pTVar36->args[uVar17];
        if (((TVar39 != 0) && (TVar61 = *(TCGArg *)(TVar39 + 0x30), TVar61 != 0)) &&
           (*(long *)(TVar39 + 0x28) == 1)) {
          TVar30 = INDEX_op_ld_i32;
          if (*(char *)(TVar39 + 3) != '\0') {
            TVar30 = INDEX_op_ld_i64;
          }
          pTVar18 = tcg_op_insert_before_sparc64(s,pTVar36,TVar30);
          pTVar18->args[0] = TVar61;
          pTVar18->args[1] = *(TCGArg *)(TVar39 + 0x10);
          pTVar18->args[2] = *(TCGArg *)(TVar39 + 0x18);
          *(undefined8 *)(TVar39 + 0x28) = 2;
        }
      }
      for (; uVar20 < uVar48 + uVar24; uVar20 = uVar20 + 1) {
        TVar39 = pTVar36->args[uVar20];
        if ((TVar39 != 0) && (*(TCGArg *)(TVar39 + 0x30) != 0)) {
          pTVar36->args[uVar20] = *(TCGArg *)(TVar39 + 0x30);
          bVar60 = true;
          if ((uVar38 >> ((byte)uVar20 & 0x1f) & 4) != 0) {
            *(undefined8 *)(TVar39 + 0x28) = 1;
          }
        }
      }
      for (uVar17 = 0; uVar32 != uVar17; uVar17 = uVar17 + 1) {
        TVar39 = pTVar36->args[uVar17];
        TVar61 = *(TCGArg *)(TVar39 + 0x30);
        if (TVar61 != 0) {
          pTVar36->args[uVar17] = TVar61;
          *(undefined8 *)(TVar39 + 0x28) = 0;
          if ((uVar38 >> ((uint)uVar17 & 0x1f) & 1) != 0) {
            TVar30 = INDEX_op_st_i32;
            if (*(char *)(TVar39 + 3) != '\0') {
              TVar30 = INDEX_op_st_i64;
            }
            pTVar18 = tcg_op_insert_after_sparc64(s,pTVar36,TVar30);
            pTVar18->args[0] = TVar61;
            pTVar18->args[1] = *(TCGArg *)(TVar39 + 0x10);
            pTVar18->args[2] = *(TCGArg *)(TVar39 + 0x18);
            *(undefined8 *)(TVar39 + 0x28) = 2;
          }
          bVar60 = true;
          if ((uVar38 >> ((byte)uVar17 & 0x1f) & 4) != 0) {
            *(undefined8 *)(TVar39 + 0x28) = 1;
          }
        }
      }
    }
    if (bVar60) {
      liveness_pass_1(s);
    }
  }
  uVar32 = 0;
  uVar17 = (ulong)(uint)s->nb_globals;
  if (s->nb_globals < 1) {
    uVar17 = uVar32;
  }
  for (; uVar17 * 0x38 - uVar32 != 0; uVar32 = uVar32 + 0x38) {
    (&s->temps[0].field_0x1)[uVar32] =
         (char)((uint)((*(ulong *)(&s->temps[0].field_0x0 + uVar32) & 0x100000000) == 0) * 0x100 +
                0x100 >> 8);
  }
  iVar52 = s->nb_temps;
  pTVar34 = s->temps + uVar17;
  for (; (long)uVar17 < (long)iVar52; uVar17 = uVar17 + 1) {
    *(ulong *)pTVar34 =
         *(ulong *)pTVar34 & 0xffffffeeffff00ff | (ulong)((uint)(*(ulong *)pTVar34 >> 0x1d) & 0x200)
    ;
    pTVar34 = pTVar34 + 1;
  }
  ppTVar1 = s->reg_to_temp;
  memset(ppTVar1,0,0x100);
  ptVar22 = (tcg_insn_unit *)(tb->tc).ptr;
  s->code_buf = ptVar22;
  s->code_ptr = ptVar22;
  paVar54 = &s->ldst_labels;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &paVar54->sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar16 = getenv("UNICORN_DEBUG");
  if (pcVar16 != (char *)0x0) {
    tcg_dump_ops_sparc64(s,false,"TCG before codegen:");
  }
  local_12c = 0xffffffff;
LAB_008f07bb:
  pTVar4 = paVar49->tqe_next;
  if (pTVar4 == (TCGOp *)0x0) {
    ptVar22 = s->code_ptr;
    s->gen_insn_end_off[local_12c] = (short)ptVar22 - (short)*(undefined4 *)&s->code_buf;
    goto LAB_008f2592;
  }
  TVar30 = *(TCGOpcode *)pTVar4;
  TVar13 = TVar30 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
  arg_life = (TCGLifeData)(TVar30 >> 0x10);
  switch(TVar13) {
  case INDEX_op_discard:
    pTVar34 = (TCGTemp *)pTVar4->args[0];
LAB_008f0823:
    temp_dead(s,pTVar34);
    goto LAB_008f10fd;
  case INDEX_op_set_label:
    puVar7 = (uint *)pTVar4->args[0];
    ptVar22 = s->code_ptr;
    *puVar7 = *puVar7 | 2;
    *(tcg_insn_unit **)(puVar7 + 2) = ptVar22;
    goto LAB_008f10fd;
  case INDEX_op_call:
    uVar24 = TVar30 >> 8 & 0xf;
    uVar38 = 6;
    if (uVar24 < 6) {
      uVar38 = uVar24;
    }
    lVar26 = (long)(int)(uVar24 - uVar38);
    if ((lVar26 * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
      uVar56 = TVar30 >> 0xc & 0xf;
      uVar17 = (ulong)uVar56;
      uVar48 = TVar30 >> 0x10;
      ptVar22 = (tcg_insn_unit *)pTVar4->args[uVar56 + uVar24];
      lVar53 = 0;
      while (bVar60 = lVar26 != 0, lVar26 = lVar26 + -1, bVar60) {
        pTVar34 = *(TCGTemp **)((long)pTVar4->args + lVar53 + (ulong)(uVar38 + uVar56) * 8);
        if (pTVar34 != (TCGTemp *)0x0) {
          temp_load(s,pTVar34,s->tcg_target_available_regs[(byte)pTVar34->field_0x3],
                    s->reserved_regs,0);
          tcg_out_st(s,*(TCGReg *)pTVar34 >> 0x18,*(TCGReg *)pTVar34 & 0xff,TCG_REG_CALL_STACK,
                     lVar53);
        }
        lVar53 = lVar53 + 8;
      }
      allocated_regs_00 = s->reserved_regs;
      for (uVar32 = 0; uVar20 = uVar17, uVar38 << 2 != uVar32; uVar32 = uVar32 + 4) {
        pTVar34 = *(TCGTemp **)((long)pTVar4->args + uVar32 * 2 + uVar17 * 8);
        if (pTVar34 != (TCGTemp *)0x0) {
          TVar14 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar32);
          if (((TCGReg)*(undefined8 *)pTVar34 & 0xff00) == 0x100) {
            if (((TCGReg)*(undefined8 *)pTVar34 & 0xff) != TVar14) {
              tcg_reg_free(s,TVar14,allocated_regs_00);
              tcg_out_mov(s,*(TCGReg *)pTVar34 >> 0x18,TVar14,*(TCGReg *)pTVar34 & 0xff);
            }
          }
          else {
            tcg_reg_free(s,TVar14,allocated_regs_00);
            temp_load(s,pTVar34,1 << ((byte)TVar14 & 0x1f),allocated_regs_00,0);
          }
          allocated_regs_00 = allocated_regs_00 | 1 << (TVar14 & TCG_REG_XMM15);
        }
      }
      for (; uVar20 < uVar56 + uVar24; uVar20 = uVar20 + 1) {
        if ((uVar48 >> ((byte)uVar20 & 0x1f) & 4) != 0) {
          temp_dead(s,(TCGTemp *)pTVar4->args[uVar20]);
        }
      }
      for (TVar14 = TCG_REG_EAX; TVar14 != 0x20; TVar14 = TVar14 + TCG_REG_ECX) {
        if ((s->tcg_target_call_clobber_regs >> (TVar14 & TCG_REG_XMM15) & 1) != 0) {
          tcg_reg_free(s,TVar14,allocated_regs_00);
        }
      }
      tcg_out_call(s,ptVar22);
      for (uVar32 = 0; uVar17 != uVar32; uVar32 = uVar32 + 1) {
        pTVar34 = (TCGTemp *)pTVar4->args[uVar32];
        uVar20 = *(ulong *)pTVar34;
        if (((uint)uVar20 & 0xff00) == 0x100) {
          ppTVar1[uVar20 & 0xff] = (TCGTemp *)0x0;
          uVar20 = *(ulong *)pTVar34;
        }
        *(ulong *)pTVar34 = uVar20 & 0xfffffff7ffff0000 | 0x100;
        *ppTVar1 = pTVar34;
        uVar38 = 4 << ((byte)uVar32 & 0x1f) & uVar48;
        if ((uVar48 >> ((uint)uVar32 & 0x1f) & 1) == 0) {
          if (uVar38 != 0) {
            temp_dead(s,pTVar34);
          }
        }
        else {
          temp_sync(s,pTVar34,allocated_regs_00,0,uVar38);
        }
      }
      goto LAB_008f10fd;
    }
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
    ;
    uVar28 = 0xe1e;
    goto LAB_008f27e4;
  case INDEX_op_br:
  case INDEX_op_mb:
switchD_008f0819_caseD_3:
    tcg_op_supported_sparc64(TVar30 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
    uVar38 = TVar30 >> 0x10;
    pTVar6 = s->tcg_op_defs;
    uVar20 = (ulong)((TVar30 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
    bVar23 = (&pTVar6->nb_oargs)[uVar20];
    uVar32 = (ulong)bVar23;
    bVar10 = (&pTVar6->nb_iargs)[uVar20];
    memcpy(new_args + (ulong)bVar23 + (ulong)bVar10,pTVar4->args + (ulong)bVar23 + (ulong)bVar10,
           (ulong)(&pTVar6->nb_cargs)[uVar20] << 3);
    TVar31 = s->reserved_regs;
    allocated_regs = TVar31;
    for (uVar17 = 0; uVar17 != bVar10; uVar17 = uVar17 + 1) {
      lVar26 = *(long *)((long)&pTVar6->args_ct + uVar20);
      lVar53 = *(long *)((long)&pTVar6->sorted_args + uVar20);
      iVar52 = *(int *)(lVar53 + uVar17 * 4 + uVar32 * 4);
      lVar57 = (long)iVar52;
      pTVar34 = (TCGTemp *)pTVar4->args[lVar57];
      uVar19 = *(ulong *)pTVar34;
      uVar24 = (uint)uVar19 & 0xff00;
      uVar3 = *(ushort *)(lVar26 + lVar57 * 8);
      if ((uVar24 == 0x300) &&
         ((((uVar42 = pTVar34->val, (uVar3 & 2) != 0 ||
            (((uVar3 >> 8 & 1) != 0 && (uVar42 + 0x80000000 >> 0x20 == 0)))) ||
           (((uVar3 >> 9 & 1) != 0 && (uVar42 >> 0x20 == 0)))) ||
          ((((uVar3 >> 10 & 1) != 0 && (uVar42 + 0x80000000 >> 0x20 == 0)) ||
           (((uVar3 >> 0xb & 1) != 0 &&
            ((ulong)((char)(uVar19 >> 0x18) != '\0') * 0x20 + 0x20 == uVar42)))))))) {
        local_78[lVar57] = 1;
        new_args[lVar57] = uVar42;
      }
      else {
        TVar25 = 0;
        if ((uVar3 & 0x40) == 0) {
          preferred_regs = 0;
LAB_008f0a7a:
          temp_load(s,pTVar34,*(TCGRegSet *)(lVar26 + 4 + lVar57 * 8),allocated_regs,TVar25);
          uVar19 = *(ulong *)pTVar34;
          bVar23 = (byte)uVar19;
          if ((*(uint *)(lVar26 + 4 + lVar57 * 8) >> ((uint)uVar19 & 0x1f) & 1) == 0)
          goto LAB_008f0aae;
          TVar39 = uVar19 & 0xff;
        }
        else {
          bVar23 = *(byte *)(lVar26 + 2 + lVar57 * 8);
          preferred_regs = pTVar4->output_pref[bVar23];
          if ((uVar19 & 0x100000000) == 0) {
            if ((uVar38 >> ((byte)iVar52 & 0x1f) & 4) != 0) {
              TVar25 = preferred_regs;
              if (uVar24 == 0x100) {
                for (uVar42 = 0; uVar17 != uVar42; uVar42 = uVar42 + 1) {
                  lVar43 = (long)*(int *)(lVar53 + uVar32 * 4 + uVar42 * 4);
                  if (((*(byte *)(lVar26 + lVar43 * 8) & 0x40) != 0) &&
                     ((uVar19 & 0xff) == new_args[lVar43])) goto LAB_008f0aae;
                }
              }
              goto LAB_008f0a7a;
            }
          }
          else if (pTVar34 == (TCGTemp *)pTVar4->args[bVar23]) goto LAB_008f0a7a;
LAB_008f0aae:
          temp_load(s,pTVar34,s->tcg_target_available_regs[uVar19 >> 0x18 & 0xff],allocated_regs,0);
          TVar14 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar26 + 4 + lVar57 * 8),allocated_regs,
                                 preferred_regs,
                                 ((undefined1  [56])*pTVar34 & (undefined1  [56])0x400000000) !=
                                 (undefined1  [56])0x0);
          TVar39 = (TCGArg)TVar14;
          tcg_out_mov(s,*(TCGReg *)pTVar34 >> 0x18,TVar14,*(TCGReg *)pTVar34 & 0xff);
          bVar23 = (byte)TVar14;
        }
        new_args[lVar57] = TVar39;
        local_78[lVar57] = 0;
        allocated_regs = allocated_regs | 1 << (bVar23 & 0x1f);
      }
    }
    for (uVar17 = uVar32; uVar17 < bVar10 + uVar32; uVar17 = uVar17 + 1) {
      if ((uVar38 >> ((byte)uVar17 & 0x1f) & 4) != 0) {
        temp_dead(s,(TCGTemp *)pTVar4->args[uVar17]);
      }
    }
    bVar23 = (&pTVar6->flags)[uVar20];
    if ((bVar23 & 2) == 0) {
      if ((bVar23 & 4) != 0) {
        for (TVar14 = TCG_REG_EAX; TVar14 != 0x20; TVar14 = TVar14 + TCG_REG_ECX) {
          if ((s->tcg_target_call_clobber_regs >> (TVar14 & TCG_REG_XMM15) & 1) != 0) {
            tcg_reg_free(s,TVar14,allocated_regs);
          }
        }
      }
      for (uVar17 = 0; uVar32 != uVar17; uVar17 = uVar17 + 1) {
        lVar26 = *(long *)((long)&pTVar6->args_ct + uVar20);
        lVar53 = (long)*(int *)(*(long *)((long)&pTVar6->sorted_args + uVar20) + uVar17 * 4);
        pTVar34 = (TCGTemp *)pTVar4->args[lVar53];
        uVar3 = *(ushort *)(lVar26 + lVar53 * 8);
        if (((char)uVar3 < '\0') &&
           (bVar23 = *(byte *)(lVar26 + 2 + lVar53 * 8), local_78[bVar23] == 0)) {
          TVar14 = *(TCGReg *)(new_args + bVar23);
        }
        else {
          if ((uVar3 & 0x20) == 0) {
            TVar25 = pTVar4->output_pref[uVar17];
            uVar24 = TVar31;
          }
          else {
            uVar24 = TVar31 | allocated_regs;
            TVar25 = pTVar4->output_pref[uVar17];
          }
          TVar14 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar26 + 4 + lVar53 * 8),uVar24,TVar25,
                                 ((undefined1  [56])*pTVar34 & (undefined1  [56])0x400000000) !=
                                 (undefined1  [56])0x0);
        }
        uVar19 = *(ulong *)pTVar34;
        if (((uint)uVar19 & 0xff00) == 0x100) {
          ppTVar1[uVar19 & 0xff] = (TCGTemp *)0x0;
          uVar19 = *(ulong *)pTVar34;
        }
        TVar31 = TVar31 | 1 << (TVar14 & TCG_REG_XMM15);
        *(ulong *)pTVar34 = (uVar19 & 0xfffffff7ffff0000) + (ulong)(byte)TVar14 + 0x100;
        ppTVar1[TVar14] = pTVar34;
        new_args[lVar53] = (ulong)TVar14;
      }
      bVar23 = (&pTVar6->flags)[uVar20];
    }
    iVar52 = local_78[2];
    cond = (TCGCond)new_args[5];
    TVar40 = (TCGType)new_args[3];
    TVar61 = new_args[2];
    TVar39 = new_args[0];
    uVar24 = *(uint *)pTVar4;
    r = (TCGType)new_args[0];
    base = (TCGType)new_args[1];
    tVar11 = (tcg_insn_unit)new_args[2];
    TVar50 = (TCGType)new_args[2];
    if ((bVar23 & 0x40) != 0) {
      if (0x2b < (uVar24 & 0xff) - 0x8d) {
switchD_008f11f0_caseD_93:
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
        ;
        iVar52 = 0xb75;
LAB_008f281b:
        g_assertion_message_expr(pcVar16,iVar52,(char *)0x0);
      }
      uVar48 = uVar24 >> 0xc & 0xf;
      TVar40 = (uVar24 >> 8 & 0xf) + TCG_TYPE_V64;
      uVar17 = (ulong)uVar48;
      iVar52 = 6;
      TVar39 = new_args[2];
      switch(uVar24 & 0xff) {
      case 0x8d:
        goto LAB_008f2093;
      case 0x8e:
        goto LAB_008f24d1;
      case 0x8f:
        tcg_out_dupm_vec(s,TVar40,uVar48,r,base,new_args[2]);
        goto LAB_008f2410;
      case 0x90:
        TVar51 = *(TCGType *)(tcg_out_vec_op_add_insn + (ulong)uVar48 * 4);
        TVar50 = base;
        goto LAB_008f192e;
      case 0x91:
        puVar27 = tcg_out_vec_op_sub_insn;
        break;
      case 0x92:
        puVar27 = tcg_out_vec_op_mul_insn;
        break;
      default:
        goto switchD_008f11f0_caseD_93;
      case 0x94:
        TVar51 = *(TCGType *)(tcg_out_vec_op_abs_insn + uVar17 * 4);
        TVar39 = new_args[1];
        TVar50 = TCG_TYPE_I32;
        goto LAB_008f192e;
      case 0x95:
        puVar27 = tcg_out_vec_op_ssadd_insn;
        break;
      case 0x96:
        puVar27 = tcg_out_vec_op_usadd_insn;
        break;
      case 0x97:
        puVar27 = tcg_out_vec_op_sssub_insn;
        break;
      case 0x98:
        puVar27 = tcg_out_vec_op_ussub_insn;
        break;
      case 0x99:
        puVar27 = tcg_out_vec_op_smin_insn;
        break;
      case 0x9a:
        puVar27 = tcg_out_vec_op_umin_insn;
        break;
      case 0x9b:
        puVar27 = tcg_out_vec_op_smax_insn;
        break;
      case 0x9c:
        puVar27 = tcg_out_vec_op_umax_insn;
        break;
      case 0x9d:
        TVar51 = 0x5db;
        TVar50 = base;
        goto LAB_008f192e;
      case 0x9e:
        TVar51 = 0x5eb;
        TVar50 = base;
        goto LAB_008f192e;
      case 0x9f:
        TVar51 = 0x5ef;
        TVar50 = base;
        goto LAB_008f192e;
      case 0xa0:
        TVar41 = (uint)(TVar40 == TCG_TYPE_V256) << 0x13 | 0x5df;
        goto LAB_008f194b;
      case 0xa3:
        goto switchD_008f11f0_caseD_a3;
      case 0xa4:
        iVar52 = 2;
        goto switchD_008f11f0_caseD_a3;
      case 0xa5:
        iVar52 = 4;
switchD_008f11f0_caseD_a3:
        uVar24 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar17 * 4) | 0x80000;
        if (TVar40 != TCG_TYPE_V256) {
          uVar24 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar17 * 4);
        }
LAB_008f159c:
        tcg_out_vex_modrm(s,uVar24,iVar52,r,base);
        ptVar22 = s->code_ptr;
        s->code_ptr = ptVar22 + 1;
        *ptVar22 = tVar11;
        goto LAB_008f2410;
      case 0xa6:
        puVar27 = tcg_out_vec_op_shls_insn;
        break;
      case 0xa7:
        puVar27 = tcg_out_vec_op_shrs_insn;
        break;
      case 0xa8:
        puVar27 = tcg_out_vec_op_sars_insn;
        break;
      case 0xa9:
        puVar27 = tcg_out_vec_op_shlv_insn;
        break;
      case 0xaa:
        puVar27 = tcg_out_vec_op_shrv_insn;
        break;
      case 0xab:
        puVar27 = tcg_out_vec_op_sarv_insn;
        break;
      case 0xac:
        if ((TCGType)new_args[3] == 0xb) {
          puVar27 = tcg_out_vec_op_cmpgt_insn;
        }
        else {
          if ((TCGType)new_args[3] != 8) {
            pcVar16 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar52 = 0xb20;
            goto LAB_008f281b;
          }
          puVar27 = tcg_out_vec_op_cmpeq_insn;
        }
        break;
      case 0xb0:
        uVar24 = 0x1c6;
        goto LAB_008f16dc;
      case 0xb1:
        tcg_out_vex_modrm(s,(uint)(TVar40 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar50);
        tVar11 = (tcg_insn_unit)new_args[3] << 4;
        goto LAB_008f1c48;
      case 0xb2:
        uVar24 = 0x1040e;
        if (uVar48 != 1) {
          if (uVar48 != 2) {
            pcVar16 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar52 = 0xb53;
            goto LAB_008f281b;
          }
          uVar24 = 0x1040c;
          if (have_avx2_sparc64 != false) {
            uVar24 = 0x10402;
          }
        }
        goto LAB_008f16dc;
      case 0xb3:
        puVar27 = tcg_out_vec_op_packss_insn;
        break;
      case 0xb4:
        puVar27 = tcg_out_vec_op_packus_insn;
        break;
      case 0xb5:
        iVar52 = 3;
        uVar24 = 0x573;
        goto LAB_008f159c;
      case 0xb6:
        uVar24 = 0x90446;
LAB_008f16dc:
        tVar11 = (tcg_insn_unit)new_args[3];
        uVar48 = uVar24 | 0x80000;
        if (TVar40 != TCG_TYPE_V256) {
          uVar48 = uVar24;
        }
        tcg_out_vex_modrm(s,uVar48,r,base,TVar50);
        ptVar22 = s->code_ptr;
        s->code_ptr = ptVar22 + 1;
        *ptVar22 = tVar11;
        goto LAB_008f2410;
      case 0xb7:
        puVar27 = tcg_out_vec_op_punpckl_insn;
        break;
      case 0xb8:
        puVar27 = tcg_out_vec_op_punpckh_insn;
      }
      TVar51 = *(TCGType *)(puVar27 + uVar17 * 4);
      TVar50 = base;
LAB_008f192e:
      TVar41 = TVar51 | 0x80000;
      if (TVar40 != TCG_TYPE_V256) {
        TVar41 = TVar51;
      }
      base = (TCGType)TVar39;
LAB_008f194b:
      tcg_out_vex_modrm(s,TVar41,r,TVar50,base);
      goto LAB_008f2410;
    }
    uVar48 = (uVar24 & 0xff) - 3;
    if (0x85 < uVar48) {
switchD_008f118e_caseD_5:
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
      ;
      uVar28 = 0xa57;
      goto LAB_008f27e4;
    }
    break;
  case INDEX_op_mov_i32:
switchD_008f0819_caseD_5:
    uVar38 = s->reserved_regs;
    TVar31 = pTVar4->output_pref[0];
    pTVar34 = (TCGTemp *)pTVar4->args[0];
    pTVar5 = (TCGTemp *)pTVar4->args[1];
    TVar50 = (TCGType)(byte)pTVar34->field_0x3;
    uVar17 = *(ulong *)pTVar5;
    if ((char)(uVar17 >> 8) == '\x02') {
      temp_load(s,pTVar5,s->tcg_target_available_regs[uVar17 >> 0x18 & 0xff],uVar38,TVar31);
      uVar17 = *(ulong *)pTVar5;
    }
    else if (((uint)(uVar17 >> 8) & 0xff) == 3) {
      val = pTVar5->val;
      if ((TVar30 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar5);
      }
      goto LAB_008f10f3;
    }
    if ((TVar30 >> 0x12 & 1) == 0) {
      uVar32 = *(ulong *)pTVar34;
      uVar24 = (uint)uVar32 & 0xff00;
      if (((TVar30 >> 0x13 & 1) == 0) || ((uVar17 & 0x100000000) != 0)) {
        if (uVar24 != 0x100) {
          uVar38 = uVar38 | 1 << ((uint)uVar17 & 0x1f);
          TVar14 = tcg_reg_alloc(s,s->tcg_target_available_regs[TVar50],uVar38,TVar31,
                                 (uVar32 & 0x400000000) != 0);
          uVar32 = *(ulong *)pTVar34 & 0xffffffffffffff00 | (ulong)(TVar14 & 0xff);
          *(ulong *)pTVar34 = uVar32;
          uVar17 = *(ulong *)pTVar5;
        }
        tcg_out_mov(s,TVar50,(TCGReg)uVar32 & 0xff,(TCGReg)uVar17 & 0xff);
      }
      else {
        if (uVar24 == 0x100) {
          ppTVar1[uVar32 & 0xff] = (TCGTemp *)0x0;
          uVar17 = (ulong)*(byte *)pTVar5;
          uVar32 = *(ulong *)pTVar34;
        }
        *(ulong *)pTVar34 = uVar32 & 0xffffffffffffff00 | uVar17 & 0xff;
        temp_dead(s,pTVar5);
      }
      uVar17 = *(ulong *)pTVar34;
      *(ulong *)pTVar34 = uVar17 & 0xfffffff7ffff00ff | 0x100;
      ppTVar1[uVar17 & 0xff] = pTVar34;
      if ((TVar30 >> 0x10 & 1) != 0) {
        temp_sync(s,pTVar34,uVar38,0,0);
      }
    }
    else {
      if ((pTVar34->field_0x4 & 0x10) == 0) {
        temp_allocate_frame(s,pTVar34);
        uVar17 = *(ulong *)pTVar5;
      }
      tcg_out_st(s,TVar50,(TCGReg)uVar17 & 0xff,(uint)*(byte *)pTVar34->mem_base,pTVar34->mem_offset
                );
      if ((TVar30 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar5);
      }
      temp_dead(s,pTVar34);
    }
    goto LAB_008f10fd;
  case INDEX_op_movi_i32:
switchD_008f0819_caseD_6:
    tcg_reg_alloc_do_movi
              (s,(TCGTemp *)pTVar4->args[0],pTVar4->args[1],arg_life,pTVar4->output_pref[0]);
    goto LAB_008f10fd;
  default:
    if (TVar13 == INDEX_op_mov_i64) goto switchD_008f0819_caseD_5;
    if (TVar13 == INDEX_op_movi_i64) goto switchD_008f0819_caseD_6;
    if (TVar13 == INDEX_op_insn_start) {
      if ((-1 < (int)local_12c) &&
         (uVar17 = (long)s->code_ptr - (long)s->code_buf,
         s->gen_insn_end_off[local_12c] = (uint16_t)uVar17, 0xffff < uVar17)) {
        __assert_fail("s->gen_insn_end_off[num_insns] == off",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                      ,0xedf,"int tcg_gen_code_sparc64(TCGContext *, TranslationBlock *)");
      }
      local_12c = local_12c + 1;
      for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
        s->gen_insn_data[(int)local_12c][lVar26] = pTVar4->args[lVar26];
      }
      goto LAB_008f10fd;
    }
    if (TVar13 != INDEX_op_dup_vec) {
      if (TVar13 != INDEX_op_dupi_vec) {
        if (TVar13 != INDEX_op_mov_vec) goto switchD_008f0819_caseD_3;
        goto switchD_008f0819_caseD_5;
      }
      goto switchD_008f0819_caseD_6;
    }
    pTVar34 = (TCGTemp *)pTVar4->args[0];
    pTVar5 = (TCGTemp *)pTVar4->args[1];
    uVar17 = *(ulong *)pTVar5;
    cVar29 = (char)(uVar17 >> 8);
    if (cVar29 != '\x03') {
      pTVar8 = s->tcg_op_defs[0x8b].args_ct;
      uVar38 = pTVar8[1].u.regs;
      uVar32 = uVar17;
      if (((uint)*(ulong *)pTVar34 & 0xff00) != 0x100) {
        uVar24 = 1 << ((byte)uVar17 & 0x1f);
        if (cVar29 != '\x01' || (TVar30 & 0x80000) != INDEX_op_discard) {
          uVar24 = 0;
        }
        TVar14 = tcg_reg_alloc(s,(pTVar8->u).regs,uVar24 | s->reserved_regs,pTVar4->output_pref[0],
                               (*(ulong *)pTVar34 & 0x400000000) != 0);
        *(ulong *)pTVar34 =
             (*(ulong *)pTVar34 & 0xfffffff7ffff0000) + (ulong)(TVar14 & 0xff) + 0x100;
        s->reg_to_temp[TVar14 & 0xff] = pTVar34;
        uVar32 = *(ulong *)pTVar5;
      }
      uVar24 = TVar30 >> 0xc & 0xf;
      TVar50 = (TVar30 >> 8 & 0xf) + TCG_TYPE_V64;
      if ((char)(uVar32 >> 8) == '\x01') {
        TVar14 = (TCGReg)uVar32 & 0xff;
        if ((uVar38 >> ((TCGReg)uVar32 & TCG_REG_XMM15) & 1) == 0) {
          bVar23 = (byte)*(undefined8 *)pTVar34;
          if ((uVar32 >> 0x23 & 1) != 0) goto LAB_008f131b;
          tcg_out_mov(s,(TCGType)(uVar17 >> 0x18) & 0xff,(TCGReg)*(undefined8 *)pTVar34 & 0xff,
                      TVar14);
          bVar23 = *(byte *)pTVar34;
          TVar14 = (TCGReg)bVar23;
        }
        else {
          bVar23 = *(byte *)pTVar34;
        }
        tcg_out_dup_vec(s,TVar50,uVar24,(uint)bVar23,TVar14);
      }
      else {
        if (((uint)(uVar32 >> 8) & 0xff) != 2) {
          pcVar16 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
          ;
          iVar52 = 0xd22;
          goto LAB_008f281b;
        }
        bVar23 = (byte)*(undefined8 *)pTVar34;
LAB_008f131b:
        tcg_out_dupm_vec(s,TVar50,uVar24,(uint)bVar23,(uint)*(byte *)pTVar5->mem_base,
                         pTVar5->mem_offset);
      }
      if ((TVar30 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar5);
      }
      if ((TVar30 >> 0x10 & 1) != 0) {
        temp_sync(s,pTVar34,s->reserved_regs,0,0);
      }
      if ((TVar30 >> 0x12 & 1) != 0) goto LAB_008f0823;
      goto LAB_008f10fd;
    }
    val = pTVar5->val;
    if ((TVar30 >> 0x13 & 1) != 0) {
      temp_dead(s,pTVar5);
    }
    TVar31 = pTVar4->output_pref[0];
LAB_008f10f3:
    tcg_reg_alloc_do_movi(s,pTVar34,val,arg_life,TVar31);
    goto LAB_008f10fd;
  }
  iVar15 = 0x402f7;
  TVar41 = 0xf7;
  TVar51 = TCG_TYPE_I32;
  rexw = TCG_TYPE_I32;
  TVar46 = TCG_TYPE_I32;
  TVar45 = TCG_TYPE_I32;
  TVar47 = TCG_TYPE_I32;
  _small = (&switchD_008f118e::switchdataD_00bb27a0)[uVar48] + 0xbb27a0;
  tVar55 = (tcg_insn_unit)new_args[0];
  uVar17 = new_args[1];
  switch(uVar24 & 0xff) {
  case 3:
    uVar24 = 0xffffffff;
    pTVar35 = (TCGLabel *)new_args[0];
    goto LAB_008f2120;
  case 4:
    if ((new_args[0] & 2) != 0) {
      ptVar22 = s->code_ptr;
      s->code_ptr = ptVar22 + 1;
      *ptVar22 = 0xf0;
      tcg_out_modrm_offset(s,0x83,1,4,0);
      ptVar22 = s->code_ptr;
      s->code_ptr = ptVar22 + 1;
      *ptVar22 = '\0';
    }
    break;
  default:
    goto switchD_008f118e_caseD_5;
  case 7:
    iVar52 = 0;
    goto LAB_008f1c7b;
  case 8:
    tcg_out_cmp(s,new_args[1] & 0xffffffff,new_args[2],local_78[2],0);
    TVar51 = TCG_TYPE_I32;
    goto LAB_008f2014;
  case 9:
  case 0x43:
    iVar52 = 0x1b6;
    goto LAB_008f1f13;
  case 10:
    iVar52 = 0x1be;
    goto LAB_008f1f13;
  case 0xb:
  case 0x45:
    iVar52 = 0x1b7;
    goto LAB_008f1f13;
  case 0xc:
    iVar52 = 0x1bf;
    goto LAB_008f1f13;
  case 0xd:
  case 0x47:
    TVar40 = TCG_TYPE_I32;
    goto LAB_008f2093;
  case 0xe:
  case 0x4a:
    if (local_78[0] == 0) {
      iVar52 = 0x2088;
      goto LAB_008f1f13;
    }
    tcg_out_modrm_offset(s,0xc6,0,base,new_args[2]);
    ptVar22 = s->code_ptr;
    s->code_ptr = ptVar22 + 1;
    *ptVar22 = tVar55;
    break;
  case 0xf:
  case 0x4b:
    if (local_78[0] == 0) {
      iVar52 = 0x489;
      goto LAB_008f1f13;
    }
    tcg_out_modrm_offset(s,0x4c7,0,base,new_args[2]);
    ptVar22 = s->code_ptr;
    *(short *)ptVar22 = (short)TVar39;
    pTVar21 = (TCGType *)(ptVar22 + 2);
    goto LAB_008f23c9;
  case 0x10:
  case 0x4c:
    if (local_78[0] != 0) {
      iVar52 = 199;
      goto LAB_008f2051;
    }
    TVar40 = TCG_TYPE_I32;
LAB_008f24d1:
    tcg_out_st(s,TVar40,r,base,new_args[2]);
    break;
  case 0x11:
    goto switchD_008f118e_caseD_11;
  case 0x12:
    goto switchD_008f118e_caseD_12;
  case 0x13:
    goto switchD_008f118e_caseD_13;
  case 0x18:
    goto switchD_008f118e_caseD_18;
  case 0x19:
    goto switchD_008f118e_caseD_19;
  case 0x1a:
    iVar52 = 4;
    goto LAB_008f20a6;
  case 0x1b:
    iVar52 = 1;
    TVar47 = TVar45;
    goto LAB_008f20a6;
  case 0x1c:
    iVar52 = 6;
    TVar47 = TVar45;
    goto LAB_008f20a6;
  case 0x1d:
    goto switchD_008f118e_caseD_1d;
  case 0x1e:
    goto switchD_008f118e_caseD_1e;
  case 0x1f:
    goto switchD_008f118e_caseD_1f;
  case 0x20:
    goto switchD_008f118e_caseD_20;
  case 0x21:
    TVar51 = TCG_TYPE_I64;
switchD_008f118e_caseD_20:
    TVar41 = TCG_TYPE_I32;
    goto LAB_008f21e2;
  case 0x22:
  case 0x5f:
    if (CONCAT44(new_args[3]._4_4_,(TCGType)new_args[3]) != 8) {
      if (CONCAT44(new_args[3]._4_4_,(TCGType)new_args[3]) == 0) {
        if (CONCAT44(new_args[4]._4_4_,(TCGType)new_args[4]) == 0x10) {
          TVar41 = 0x489;
          r = TVar50;
        }
        else {
          if (CONCAT44(new_args[4]._4_4_,(TCGType)new_args[4]) != 8) goto LAB_008f2830;
          TVar41 = 0x6088;
          r = TVar50;
        }
        goto LAB_008f2408;
      }
LAB_008f2830:
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
      ;
      uVar28 = 0xa22;
      goto LAB_008f27e4;
    }
    if (CONCAT44(new_args[4]._4_4_,(TCGType)new_args[4]) != 8) goto LAB_008f2830;
    TVar39 = (TCGArg)(r + TCG_TYPE_V256);
    TVar41 = 0x88;
    r = TVar50;
    goto LAB_008f2408;
  case 0x23:
switchD_008f118e_caseD_23:
    if (new_args[0] < 8 && new_args[1] < 4) {
      TVar41 = 0x1b6;
      uVar17 = (ulong)(base | TCG_TYPE_V256);
      goto LAB_008f202b;
    }
    tcg_out_ext16u(s,r,base);
    iVar52 = 5;
LAB_008f23ec:
    TVar50 = 8;
    goto LAB_008f23f6;
  case 0x24:
    if (7 < new_args[0] || 3 < new_args[1]) {
      tcg_out_modrm(s,0x1bf,r,base);
      iVar52 = 7;
      goto LAB_008f23ec;
    }
    TVar41 = 0x1be;
    uVar17 = (ulong)(base | TCG_TYPE_V256);
    goto LAB_008f202b;
  case 0x25:
    iVar52 = 0x1ac;
    goto LAB_008f1c2e;
  case 0x26:
    iVar52 = 0;
    goto LAB_008f2104;
  case 0x27:
    goto switchD_008f118e_caseD_27;
  case 0x28:
    goto switchD_008f118e_caseD_28;
  case 0x29:
    goto switchD_008f118e_caseD_29;
  case 0x2a:
    goto switchD_008f118e_caseD_2a;
  case 0x2f:
    goto switchD_008f118e_caseD_2f;
  case 0x30:
    goto switchD_008f118e_caseD_30;
  case 0x31:
  case 0x6b:
    goto LAB_008f1cac;
  case 0x32:
  case 0x6c:
    tcg_out_ext16u(s,r,base);
    break;
  case 0x33:
  case 0x6e:
    tcg_out_rolw_8(s,r);
    break;
  case 0x34:
  case 0x6f:
    tcg_out_bswap32(s,r);
    break;
  case 0x35:
    goto switchD_008f118e_caseD_35;
  case 0x36:
    goto switchD_008f118e_caseD_36;
  case 0x37:
    TVar41 = TCG_TYPE_I32;
    goto LAB_008f1e3b;
  case 0x3c:
    tStackY_180 = 0x1f;
    goto LAB_008f1f66;
  case 0x3d:
    goto switchD_008f118e_caseD_3d;
  case 0x3e:
    TVar41 = 0x201b8;
    goto LAB_008f202b;
  case 0x41:
    iVar52 = 0x1000;
LAB_008f1c7b:
    uVar17 = (ulong)(TCGType)new_args[3];
    tcg_out_cmp(s,new_args[1],new_args[2],local_78[2],iVar52);
    tcg_out_modrm(s,""[uVar17] | 0x4190,0,r);
    base = r;
LAB_008f1cac:
    tcg_out_ext8u(s,r,base);
    break;
  case 0x42:
    tcg_out_cmp(s,new_args[1] & 0xffffffff,new_args[2],local_78[2],0x1000);
    TVar51 = 0x1000;
    goto LAB_008f2014;
  case 0x44:
    iVar52 = 0x11be;
    goto LAB_008f1f13;
  case 0x46:
    iVar52 = 0x11bf;
    goto LAB_008f1f13;
  case 0x48:
    iVar52 = 0x1063;
LAB_008f1f13:
    tcg_out_modrm_offset(s,iVar52,r,base,new_args[2]);
    break;
  case 0x49:
    TVar40 = TCG_TYPE_I64;
LAB_008f2093:
    tcg_out_ld(s,TVar40,r,base,new_args[2]);
    break;
  case 0x4d:
    if (local_78[0] == 0) {
      TVar40 = TCG_TYPE_I64;
      goto LAB_008f24d1;
    }
    iVar52 = 0x10c7;
LAB_008f2051:
    tcg_out_modrm_offset(s,iVar52,0,base,new_args[2]);
    pTVar21 = (TCGType *)s->code_ptr;
    *pTVar21 = r;
    goto LAB_008f23c5;
  case 0x4e:
    TVar51 = 0x1000;
switchD_008f118e_caseD_11:
    iVar52 = 0;
    TVar47 = TVar51;
    if (new_args[0] == new_args[1]) goto LAB_008f20a6;
    if (local_78[2] != 0) {
      uVar17 = 0xffffffffffffffff;
LAB_008f2539:
      TVar51 = TVar51 | 0x8d;
      TVar39 = uVar17 & 0xffffffff;
LAB_008f2553:
      TVar44 = 0;
LAB_008f2556:
      tcg_out_modrm_sib_offset(s,TVar51,r,base,(int)TVar39,(int)TVar44,TVar61);
      break;
    }
    if (new_args[0] != new_args[2]) {
      TVar61 = 0;
      uVar17 = new_args[2];
      goto LAB_008f2539;
    }
    uVar17 = new_args[1] & 0xffffffff;
    base = r;
    goto LAB_008f231c;
  case 0x4f:
    TVar46 = 0x1000;
switchD_008f118e_caseD_12:
    iVar52 = 5;
    TVar47 = TVar46;
    goto LAB_008f20a6;
  case 0x50:
    TVar45 = 0x1000;
switchD_008f118e_caseD_13:
    if (local_78[2] != 0) {
      if (TVar50 == (int)(char)tVar11) {
        tcg_out_modrm(s,TVar45 | 0x6b,r,r);
        ptVar22 = s->code_ptr;
        s->code_ptr = ptVar22 + 1;
        *ptVar22 = tVar11;
      }
      else {
        tcg_out_modrm(s,TVar45 | 0x69,r,r);
        pTVar21 = (TCGType *)s->code_ptr;
        *pTVar21 = TVar50;
LAB_008f23c5:
        pTVar21 = pTVar21 + 1;
LAB_008f23c9:
        s->code_ptr = (tcg_insn_unit *)pTVar21;
      }
      break;
    }
    TVar41 = TVar45 | 0x1af;
    goto LAB_008f240b;
  case 0x55:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_18:
    r = TCG_TYPE_V256|TCG_TYPE_V128;
    TVar50 = (TCGType)new_args[4];
    goto LAB_008f240b;
  case 0x56:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_19:
    r = TCG_TYPE_V256|TCG_TYPE_V64;
    TVar50 = (TCGType)new_args[4];
    goto LAB_008f240b;
  case 0x57:
    iVar52 = 4;
    goto LAB_008f1e2d;
  case 0x58:
    iVar52 = 1;
    goto LAB_008f1e2d;
  case 0x59:
    iVar52 = 6;
LAB_008f1e2d:
    TVar47 = 0x1000;
LAB_008f20a6:
    TVar51 = TVar47 + iVar52;
    uVar17 = new_args[2];
    if (local_78[2] == 0) {
      uVar17 = new_args[2] & 0xffffffff;
      base = r;
LAB_008f231c:
      tgen_arithr(s,TVar51,base,(int)uVar17);
    }
    else {
LAB_008f20be:
      iVar52 = 0;
LAB_008f20c1:
      tgen_arithi(s,TVar51,r,uVar17,iVar52);
    }
    break;
  case 0x5a:
    TVar51 = 0x1000;
switchD_008f118e_caseD_1d:
    iVar15 = 0x6f7;
    TVar41 = TVar51;
    TVar40 = TCG_TYPE_V256;
    if ((new_args[0] == new_args[1] || local_78[2] == 0) || (2 < new_args[2] - 1)) {
LAB_008f219e:
      TVar51 = TVar40;
      if (have_bmi2 != true) {
LAB_008f21e2:
        if (local_78[2] == 0) {
          TVar41 = TVar41 + 0xd3;
          r = TVar51;
          goto LAB_008f2408;
        }
LAB_008f21ee:
        iVar52 = TVar51 + TVar41;
        goto LAB_008f23f6;
      }
      if (local_78[2] != 0) {
        tcg_out_mov(s,(uint)(TVar41 != TCG_TYPE_I32),r,base);
        goto LAB_008f21ee;
      }
      TVar41 = TVar41 + iVar15;
      goto LAB_008f194b;
    }
    TVar51 = TVar51 | 0x8d;
    TVar39 = new_args[1];
    if (new_args[2] == 1) {
      TVar61 = 0;
      goto LAB_008f2553;
    }
    TVar61 = 0;
    base = ~TCG_TYPE_I32;
    TVar44 = new_args[2];
    goto LAB_008f2556;
  case 0x5b:
    TVar51 = 0x1000;
switchD_008f118e_caseD_1e:
    TVar41 = TVar51;
    TVar40 = TCG_TYPE_COUNT;
    goto LAB_008f219e;
  case 0x5c:
    TVar51 = 0x1000;
switchD_008f118e_caseD_1f:
    iVar15 = 0x202f7;
    TVar41 = TVar51;
    TVar40 = TCG_TYPE_V256|TCG_TYPE_V128;
    goto LAB_008f219e;
  case 0x5d:
    goto switchD_008f118e_caseD_5d;
  case 0x5e:
    TVar51 = TCG_TYPE_I64;
switchD_008f118e_caseD_5d:
    TVar41 = 0x1000;
    goto LAB_008f21e2;
  case 0x60:
    if (CONCAT44(new_args[3]._4_4_,(TCGType)new_args[3]) + new_args[2] != 0x20)
    goto switchD_008f118e_caseD_23;
    tcg_out_mov(s,TCG_TYPE_I32,r,base);
    iVar52 = 5;
    goto LAB_008f23f6;
  case 0x62:
    iVar52 = 0x11ac;
LAB_008f1c2e:
    tcg_out_modrm(s,iVar52,TVar50,r);
    tVar11 = (tcg_insn_unit)new_args[3];
LAB_008f1c48:
    ptVar22 = s->code_ptr;
    s->code_ptr = ptVar22 + 1;
    *ptVar22 = tVar11;
    break;
  case 99:
  case 0x6a:
    tcg_out_ext32s(s,r,base);
    break;
  case 100:
  case 0x65:
  case 0x6d:
    tcg_out_ext32u(s,r,base);
    break;
  case 0x66:
    TVar50 = 0x20;
    iVar52 = 0x1005;
LAB_008f23f6:
    tcg_out_shifti(s,iVar52,r,TVar50);
    break;
  case 0x67:
    iVar52 = 0x1000;
LAB_008f2104:
    pTVar35 = (TCGLabel *)CONCAT44(new_args[3]._4_4_,(TCGType)new_args[3]);
    tcg_out_cmp(s,new_args[0],new_args[1],local_78[1],iVar52);
    _small = 0xbb2bc8;
    uVar24 = (uint)""[TVar61 & 0xffffffff];
LAB_008f2120:
    tcg_out_jxx(s,uVar24,pTVar35,_small);
    break;
  case 0x68:
    TVar51 = 0x1000;
switchD_008f118e_caseD_2f:
    tcg_out_ext8s(s,r,base,TVar51);
    break;
  case 0x69:
    rexw = 0x1000;
switchD_008f118e_caseD_30:
    tcg_out_ext16s(s,r,base,rexw);
    break;
  case 0x70:
    tcg_out_bswap64(s,r);
    break;
  case 0x71:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_35:
    r = TCG_TYPE_V64;
    goto LAB_008f2408;
  case 0x72:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_36:
    r = TCG_TYPE_V128;
    goto LAB_008f2408;
  case 0x73:
    TVar41 = 0x1000;
    TVar51 = TCG_TYPE_I64;
LAB_008f1e3b:
    if (local_78[2] == 0) {
      TVar41 = TVar41 | 0x2f2;
      goto LAB_008f194b;
    }
    tcg_out_mov(s,TVar51,r,base);
    TVar51 = TVar41 | TCG_TYPE_V256;
    uVar17 = ~TVar61;
    goto LAB_008f20be;
  case 0x78:
    TVar51 = 0x1000;
    tStackY_180 = 0x3f;
LAB_008f1f66:
    if (have_lzcnt == true) {
      TVar40 = TVar51 | 0x201bd;
LAB_008f1f7f:
      tcg_out_modrm(s,TVar40,r,base);
      if (iVar52 != 0) break;
      cond = TCG_COND_LTU;
      TVar40 = TVar50;
    }
    else {
      tcg_out_modrm(s,TVar51 | 0x1bd,r,base);
      tgen_arithi(s,TVar51 | (TCG_TYPE_V256|TCG_TYPE_V64),r,tStackY_180,0);
      TVar41 = TVar51 | 0x85;
      TVar40 = base;
LAB_008f1ffe:
      tcg_out_modrm(s,TVar41,TVar40,base);
      cond = TCG_COND_EQ;
      TVar40 = TVar50;
    }
LAB_008f2014:
    tcg_out_cmov(s,cond,TVar51,r,TVar40);
    break;
  case 0x79:
    TVar51 = 0x1000;
switchD_008f118e_caseD_3d:
    if (have_bmi1_sparc64 != true) {
      TVar41 = TVar51 | 0x1bc;
      TVar40 = r;
      goto LAB_008f1ffe;
    }
    TVar40 = TVar51 | 0x201bc;
    goto LAB_008f1f7f;
  case 0x7a:
    TVar41 = 0x211b8;
LAB_008f202b:
    TVar50 = (TCGType)uVar17;
    goto LAB_008f240b;
  case 0x7b:
    rexw = 0x1000;
switchD_008f118e_caseD_27:
    if (local_68 == 0) {
      tgen_arithr(s,rexw,r,(TCGType)new_args[4]);
    }
    else {
      tgen_arithi(s,rexw,r,CONCAT44(new_args[4]._4_4_,(TCGType)new_args[4]),1);
    }
    TVar51 = rexw | TCG_TYPE_V64;
    uVar17 = CONCAT44(new_args[5]._4_4_,(TCGCond)new_args[5]);
    if (local_64 != 0) {
      iVar52 = 1;
      r = base;
      goto LAB_008f20c1;
    }
    goto LAB_008f231c;
  case 0x7c:
    TVar45 = 0x1000;
switchD_008f118e_caseD_28:
    if (local_68 == 0) {
      tgen_arithr(s,TVar45 | TCG_TYPE_COUNT,r,(TCGType)new_args[4]);
    }
    else {
      tgen_arithi(s,TVar45 | TCG_TYPE_COUNT,r,CONCAT44(new_args[4]._4_4_,(TCGType)new_args[4]),1);
    }
    TVar51 = TVar45 | TCG_TYPE_V128;
    uVar17 = CONCAT44(new_args[5]._4_4_,(TCGCond)new_args[5]);
    if (local_64 != 0) {
      iVar52 = 1;
      r = base;
      goto LAB_008f20c1;
    }
    goto LAB_008f231c;
  case 0x7d:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_29:
    r = TCG_TYPE_V256;
    TVar50 = (TCGType)new_args[3];
    goto LAB_008f240b;
  case 0x7e:
    TVar41 = 0x10f7;
switchD_008f118e_caseD_2a:
    r = TCG_TYPE_COUNT;
    TVar50 = (TCGType)new_args[3];
    goto LAB_008f240b;
  case 0x82:
    if (new_args[0] == 0) {
      ptVar22 = (tcg_insn_unit *)s->code_gen_epilogue;
    }
    else {
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_EAX,new_args[0]);
      ptVar22 = (tcg_insn_unit *)s->tb_ret_addr;
    }
    tcg_out_jmp(s,ptVar22);
    break;
  case 0x83:
    if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
      tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + new_args[0]));
      ptVar22 = s->code_ptr;
    }
    else {
      ptVar22 = s->code_ptr;
      iVar52 = (int)ptVar22;
      if ((iVar52 + 4U & 0xfffffffc) - iVar52 != 1) {
        for (iVar52 = (iVar52 - (iVar52 + 4U & 0xfffffffc)) + 2; s->code_ptr = ptVar22 + 1,
            iVar52 != 0; iVar52 = iVar52 + 1) {
          *ptVar22 = 'f';
          ptVar22 = s->code_ptr;
        }
        *ptVar22 = 0x90;
        ptVar22 = s->code_ptr;
      }
      s->code_ptr = ptVar22 + 1;
      *ptVar22 = 0xe9;
      ptVar22 = s->code_ptr;
      s->tb_jmp_insn_offset[new_args[0]] = (long)ptVar22 - (long)s->code_buf;
      ptVar22[0] = '\0';
      ptVar22[1] = '\0';
      ptVar22[2] = '\0';
      ptVar22[3] = '\0';
      ptVar22 = ptVar22 + 4;
      s->code_ptr = ptVar22;
    }
    uVar17 = (long)ptVar22 - (long)s->code_buf;
    s->tb_jmp_reset_offset[(int)r] = (uint16_t)uVar17;
    if (0xffff < uVar17) {
      __assert_fail("s->tb_jmp_reset_offset[which] == off",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                    ,0x123,"void set_jmp_reset_offset(TCGContext *, int)");
    }
    break;
  case 0x84:
    TVar41 = 0xff;
    r = TCG_TYPE_V256;
LAB_008f2408:
    TVar50 = (TCGType)TVar39;
LAB_008f240b:
    tcg_out_modrm(s,TVar41,r,TVar50);
    break;
  case 0x85:
    _Var12 = false;
    goto LAB_008f223b;
  case 0x86:
    _Var12 = false;
    goto LAB_008f2254;
  case 0x87:
    _Var12 = true;
LAB_008f223b:
    tcg_out_qemu_ld(s,new_args,_Var12);
    break;
  case 0x88:
    _Var12 = true;
LAB_008f2254:
    tcg_out_qemu_st(s,new_args,_Var12);
  }
LAB_008f2410:
  for (uVar17 = 0; uVar32 != uVar17; uVar17 = uVar17 + 1) {
    uVar24 = 4 << ((byte)uVar17 & 0x1f) & uVar38;
    if ((uVar38 >> ((uint)uVar17 & 0x1f) & 1) == 0) {
      if (uVar24 != 0) {
        temp_dead(s,(TCGTemp *)pTVar4->args[uVar17]);
      }
    }
    else {
      temp_sync(s,(TCGTemp *)pTVar4->args[uVar17],TVar31,0,uVar24);
    }
  }
LAB_008f10fd:
  if (s->code_gen_highwater < s->code_ptr) {
    return -1;
  }
  paVar49 = &pTVar4->link;
  if (0xffff < (ulong)((long)s->code_ptr - (long)s->code_buf)) {
    return -2;
  }
  goto LAB_008f07bb;
LAB_008f2592:
  pTVar9 = paVar54->sqh_first;
  if (pTVar9 == (TCGLabelQemuLdst *)0x0) {
    iVar52 = tcg_out_pool_finalize(s);
    if (iVar52 < 0) {
      return iVar52;
    }
    paVar37 = &s->labels;
    do {
      pTVar35 = paVar37->sqh_first;
      if (pTVar35 == (TCGLabel *)0x0) {
        return *(int *)&s->code_ptr - *(int *)&s->code_buf;
      }
      value = (pTVar35->u).value;
      pTVar59 = (TCGRelocation *)&pTVar35->relocs;
      while (pTVar59 = (pTVar59->next).sqe_next, pTVar59 != (TCGRelocation *)0x0) {
        _Var12 = patch_reloc(pTVar59->ptr,pTVar59->type,value,pTVar59->addend);
        if (!_Var12) {
          return -2;
        }
      }
      paVar37 = (anon_struct_16_2_9a852307_for_labels *)&pTVar35->next;
    } while( true );
  }
  uVar38 = pTVar9->oi;
  uVar24 = uVar38 >> 4;
  if (pTVar9->is_ld != true) {
    *(int *)pTVar9->label_ptr[0] = ((int)ptVar22 - (int)pTVar9->label_ptr[0]) + -4;
    tcg_out_modrm(s,0x108b,7,5);
    tcg_out_mov(s,(uint)((~uVar38 & 0x30) == 0),TCG_REG_EDX,pTVar9->datalo_reg);
    tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar38);
    tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar9->raddr);
    tcg_out_push(s,8);
    pptVar58 = (tcg_insn_unit **)(qemu_st_helpers + (uVar24 & 0xb));
    goto LAB_008f26e1;
  }
  iVar52 = (uint)(pTVar9->type == TCG_TYPE_I64) << 0xc;
  *(int *)pTVar9->label_ptr[0] = ((int)ptVar22 - (int)pTVar9->label_ptr[0]) + -4;
  tcg_out_modrm(s,0x108b,7,5);
  tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar38);
  pptVar58 = &pTVar9->raddr;
  tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar9->raddr);
  tcg_out_call(s,(tcg_insn_unit *)qemu_ld_helpers[uVar24 & 0xb]);
  TVar14 = pTVar9->datalo_reg;
  switch(uVar24 & 7) {
  default:
    TVar50 = TCG_TYPE_I32;
    goto LAB_008f26d3;
  case 3:
    TVar50 = TCG_TYPE_I64;
LAB_008f26d3:
    tcg_out_mov(s,TVar50,TVar14,TCG_REG_EAX);
    break;
  case 4:
    tcg_out_ext8s(s,TVar14,0,iVar52);
    break;
  case 5:
    tcg_out_ext16s(s,TVar14,0,iVar52);
    break;
  case 6:
    tcg_out_ext32s(s,TVar14,0);
    break;
  case 7:
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
    ;
    uVar28 = 0x768;
LAB_008f27e4:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",pcVar16,uVar28);
    abort();
  }
LAB_008f26e1:
  tcg_out_jmp(s,*pptVar58);
  ptVar22 = s->code_ptr;
  paVar54 = (anon_struct_16_2_9a852307_for_ldst_labels *)&pTVar9->next;
  if (s->code_gen_highwater < ptVar22) {
    return -1;
  }
  goto LAB_008f2592;
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}